

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O1

int archive_read_disk_set_standard_lookup(archive *a)

{
  undefined8 *__s;
  undefined8 *__s_00;
  int iVar1;
  
  __s = (undefined8 *)malloc(0x818);
  __s_00 = (undefined8 *)malloc(0x818);
  if (__s == (undefined8 *)0x0 || __s_00 == (undefined8 *)0x0) {
    archive_set_error(a,0xc,"Can\'t allocate uname/gname lookup cache");
    free(__s);
    free(__s_00);
    iVar1 = -0x1e;
  }
  else {
    iVar1 = 0;
    memset(__s,0,0x818);
    *__s = a;
    __s[4] = 0x7f;
    memset(__s_00,0,0x818);
    *__s_00 = a;
    __s_00[4] = 0x7f;
    archive_read_disk_set_gname_lookup(a,__s_00,lookup_gname,cleanup);
    archive_read_disk_set_uname_lookup(a,__s,lookup_uname,cleanup);
  }
  return iVar1;
}

Assistant:

int
archive_read_disk_set_standard_lookup(struct archive *a)
{
	struct name_cache *ucache = malloc(sizeof(struct name_cache));
	struct name_cache *gcache = malloc(sizeof(struct name_cache));

	if (ucache == NULL || gcache == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate uname/gname lookup cache");
		free(ucache);
		free(gcache);
		return (ARCHIVE_FATAL);
	}

	memset(ucache, 0, sizeof(*ucache));
	ucache->archive = a;
	ucache->size = name_cache_size;
	memset(gcache, 0, sizeof(*gcache));
	gcache->archive = a;
	gcache->size = name_cache_size;

	archive_read_disk_set_gname_lookup(a, gcache, lookup_gname, cleanup);
	archive_read_disk_set_uname_lookup(a, ucache, lookup_uname, cleanup);

	return (ARCHIVE_OK);
}